

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O1

bool __thiscall
ON__OBSOLETE__CircleCurve::Read(ON__OBSOLETE__CircleCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  long lVar2;
  ON_Plane *pOVar3;
  ON_Circle *pOVar4;
  byte bVar5;
  int major_version;
  int minor_version;
  ON_Circle circle;
  int local_a8 [2];
  ON_Circle local_a0;
  
  bVar5 = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_a8,local_a8 + 1);
  if ((bVar1) && (local_a8[0] == 1)) {
    pOVar3 = &ON_Plane::World_xy;
    pOVar4 = &local_a0;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar4->plane).origin.x = (pOVar3->origin).x;
      pOVar3 = (ON_Plane *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pOVar4 = (ON_Circle *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    local_a0.radius = 1.0;
    bVar1 = ON_BinaryArchive::ReadCircle(file,&local_a0);
    ON_Arc::operator=(&(this->super_ON_ArcCurve).m_arc,&local_a0);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInterval(file,&(this->super_ON_ArcCurve).m_t);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&(this->super_ON_ArcCurve).m_dim);
    }
    if (((this->super_ON_ArcCurve).m_dim & 0xfffffffeU) != 2) {
      (this->super_ON_ArcCurve).m_dim = 3;
    }
    ON_Plane::~ON_Plane(&local_a0.plane);
  }
  return bVar1;
}

Assistant:

bool ON__OBSOLETE__CircleCurve::Read(
       ON_BinaryArchive& file // open binary file
     )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if (major_version==1) 
    {
      // common to all 1.x versions
      ON_Circle circle;
      rc = file.ReadCircle( circle );
      m_arc = circle;
      if (rc) 
        rc = file.ReadInterval( m_t );
      if (rc) 
        rc = file.ReadInt(&m_dim);
      if ( m_dim != 2 && m_dim != 3 )
        m_dim = 3;
    }
  }

  return rc;
}